

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# celu.c
# Opt level: O0

rt_function_error_t exec_celu(rt_function_t *f)

{
  float fVar1;
  long *plVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  float fVar6;
  float local_4c;
  float local_44;
  float *y;
  float x;
  int s1;
  int s0;
  int j;
  int i;
  celu_private_t *p;
  celu_local_context_t *c;
  rt_function_t *f_local;
  
  plVar2 = (long *)f->local_context;
  plVar3 = (long *)*plVar2;
  x = 1.4013e-45;
  for (s0 = *(int *)((long)plVar2 + 0xc); s0 < (int)plVar3[6]; s0 = s0 + 1) {
    x = (float)(*(int *)(plVar3[7] + (long)s0 * 4) * (int)x);
  }
  lVar5 = plVar3[2];
  for (s0 = 0; s0 < (int)lVar5 / (int)x; s0 = s0 + 1) {
    for (s1 = 0; s1 < (int)x; s1 = s1 + 1) {
      local_4c = *(float *)(*(long *)(*plVar3 + 0x18) + (long)(s0 * (int)x) * 4 + (long)s1 * 4);
      lVar4 = *(long *)(plVar3[3] + 0x18);
      local_44 = local_4c;
      if (local_4c <= 0.0) {
        fVar1 = *(float *)(plVar2 + 1);
        fVar6 = expf(local_4c);
        local_44 = fVar1 * (fVar6 - 1.0);
      }
      *(float *)(lVar4 + (long)(s0 * (int)x * 2) * 4 + (long)s1 * 4) = local_44;
      if (0.0 <= local_4c) {
        fVar1 = *(float *)(plVar2 + 1);
        fVar6 = expf(-local_4c);
        local_4c = fVar1 * (fVar6 - 1.0);
      }
      else {
        local_4c = -local_4c;
      }
      *(float *)(lVar4 + (long)(s0 * (int)x * 2) * 4 + (long)(int)x * 4 + (long)s1 * 4) = local_4c;
    }
  }
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t exec_celu(rt_function_t *f) {
  celu_local_context_t *c = (celu_local_context_t *)(f->local_context);
  celu_private_t *p = (celu_private_t *)(c->data);
  int i, j, s0 = 1, s1;

  for (i = c->axis; i < p->in_shape.size; ++i) {
    s0 *= p->in_shape.data[i];
  }
  s1 = p->input_size / s0;

  for (i = 0; i < s1; ++i) {
    for (j = 0; j < s0; ++j) {
      float x = *((float *)(p->input->data) + i * s0 + j);
      float *y = (float *)(p->output->data);
      *(y + i * s0 * 2 + j) = x > 0.0f ? x : c->alpha * (expf(x) - 1.0f);
      *(y + i * s0 * 2 + s0 + j) = x < 0.0f ? -x : c->alpha * (expf(-x) - 1.0f);
    }
  }
  return RT_FUNCTION_ERROR_NOERROR;
}